

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

char * __thiscall
Jinx::StaticArena<8192ul,16ul>::allocate<8ul>(StaticArena<8192ul,16ul> *this,size_t n)

{
  char *r;
  StaticArena<8192ul,16ul> *pSVar1;
  ulong uVar2;
  StaticArena<8192ul,16ul> *pSVar3;
  size_t local_8;
  
  pSVar1 = *(StaticArena<8192ul,16ul> **)(this + 0x2000);
  if (this <= pSVar1) {
    pSVar3 = this + 0x2000;
    if (pSVar1 <= pSVar3) {
      uVar2 = n + 0xf & 0xfffffffffffffff0;
      if ((ulong)((long)pSVar3 - (long)pSVar1) < uVar2) {
        LOCK();
        Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
        UNLOCK();
        LOCK();
        Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + n);
        UNLOCK();
        local_8 = n;
        if (Mem::allocFn.super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        pSVar1 = (StaticArena<8192ul,16ul> *)
                 (*Mem::allocFn._M_invoker)((_Any_data *)&Mem::allocFn,&local_8);
      }
      else {
        *(StaticArena<8192ul,16ul> **)pSVar3 = pSVar1 + uVar2;
      }
      return (char *)pSVar1;
    }
  }
  __assert_fail("pointer_in_buffer(m_ptr) && \"short_alloc has outlived arena\"",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                ,0xc9,
                "char *Jinx::StaticArena<8192>::allocate(std::size_t) [N = 8192, alignment = 16, ReqAlign = 8UL]"
               );
}

Assistant:

char * StaticArena<N, alignment>::allocate(std::size_t n)
	{
		static_assert(ReqAlign <= alignment, "alignment is too small for this arena");
		assert(pointer_in_buffer(m_ptr) && "short_alloc has outlived arena");
		auto const aligned_n = align_up(n);
		if (static_cast<decltype(aligned_n)>(m_buffer + N - m_ptr) >= aligned_n)
		{
			char * r = m_ptr;
			m_ptr += aligned_n;
			return r;
		}

		static_assert(alignment <= alignof(std::max_align_t), "you've chosen an "
			"alignment that is larger than alignof(std::max_align_t), and "
			"cannot be guaranteed by normal operator new");
		return static_cast<char *>(Jinx::MemAllocate(n));
	}